

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetBooleanVerifier::
verifyIntegerGreaterOrEqual2
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,
          GLint reference1)

{
  bool bVar1;
  long lVar2;
  undefined8 uStack_1c0;
  GLboolean referenceAsGLBoolean [2];
  StateQueryMemoryWriteGuard<unsigned_char[2]> boolVector;
  MessageBuilder local_1b0;
  
  uStack_1c0 = 0x39c383;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[2]>::
  StateQueryMemoryWriteGuard(&boolVector);
  uStack_1c0 = 0x39c397;
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,boolVector.m_value);
  uStack_1c0 = 0x39c3a2;
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[2]>::verifyValidity
                    (&boolVector,testCtx);
  if (bVar1) {
    referenceAsGLBoolean[0] = reference0 != 0;
    referenceAsGLBoolean[1] = reference1 != 0;
    for (lVar2 = 2; lVar2 != 4; lVar2 = lVar2 + 1) {
      if (boolVector.m_preguard[lVar2] != '\x01') {
        if (boolVector.m_preguard[lVar2] == '\0') {
          if (referenceAsGLBoolean[lVar2 + -2] == '\0') goto LAB_0039c472;
          local_1b0.m_log = testCtx->m_log;
          uStack_1c0 = 0x39c408;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
          uStack_1c0 = 0x39c417;
          std::operator<<((ostream *)&local_1b0.m_str,"// ERROR: expected GL_TRUE");
          uStack_1c0 = 0x39c422;
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          local_1b0.m_log = testCtx->m_log;
          uStack_1c0 = 0x39c438;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
          uStack_1c0 = 0x39c447;
          std::operator<<((ostream *)&local_1b0.m_str,"// ERROR: expected GL_TRUE or GL_FALSE");
          uStack_1c0 = 0x39c452;
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        uStack_1c0 = 0x39c45a;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
        if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
          uStack_1c0 = 0x39c472;
          tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
        }
      }
LAB_0039c472:
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyIntegerGreaterOrEqual2 (tcu::TestContext& testCtx, GLenum name, GLint reference0, GLint reference1)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean[2]> boolVector;
	glGetBooleanv(name, boolVector);

	if (!boolVector.verifyValidity(testCtx))
		return;

	const GLboolean referenceAsGLBoolean[2] =
	{
		reference0 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
		reference1 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(referenceAsGLBoolean); ++ndx)
	{
		if (boolVector[ndx] == GL_TRUE) // state is non-zero, could be greater than any integer
		{
			continue;
		}
		else if (boolVector[ndx] == GL_FALSE) // state is zero
		{
			if (referenceAsGLBoolean[ndx] > 0) // and reference is greater than zero?
			{
				testCtx.getLog() << TestLog::Message << "// ERROR: expected GL_TRUE" << TestLog::EndMessage;
				if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
			}
		}
		else
		{
			testCtx.getLog() << TestLog::Message << "// ERROR: expected GL_TRUE or GL_FALSE" << TestLog::EndMessage;
			if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
		}
	}
}